

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

bool __thiscall QTextStreamPrivate::fillReadBuffer(QTextStreamPrivate *this,qint64 maxBytes)

{
  QString *a;
  char16_t *pcVar1;
  ulong alloc;
  qsizetype alloc_00;
  char16_t *pcVar2;
  bool bVar3;
  ssize_t sVar4;
  char16_t *pcVar5;
  size_t in_RCX;
  Data *pDVar6;
  void *__buf;
  long lVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  char buf [16384];
  char16_t **local_4058;
  EncodedData<QByteArrayView> local_4050;
  storage_type local_4038 [16384];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QIODevice::isTextModeEnabled(this->device);
  if (bVar3) {
    QIODevice::setTextModeEnabled(this->device,false);
  }
  memset(local_4038,0xaa,0x4000);
  __buf = (void *)0x4000;
  if (maxBytes < 0x4000) {
    __buf = (void *)maxBytes;
  }
  if (maxBytes == -1) {
    __buf = (void *)0x4000;
  }
  sVar4 = QIODevice::read(this->device,(int)local_4038,__buf,in_RCX);
  if (bVar3) {
    QIODevice::setTextModeEnabled(this->device,true);
  }
  if (sVar4 < 1) goto LAB_0011d445;
  a = &this->readBuffer;
  uVar10 = (this->readBuffer).d.size;
  local_4050.decoder = &this->toUtf16;
  local_4050.data.m_size = sVar4;
  local_4050.data.m_data = local_4038;
  operator+=(a,&local_4050);
  alloc = (this->readBuffer).d.size;
  if (!bVar3 || alloc <= uVar10) goto LAB_0011d445;
  pDVar6 = (a->d).d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,alloc,KeepSize);
    pDVar6 = (this->readBuffer).d.d;
    pcVar5 = (this->readBuffer).d.ptr;
    pcVar9 = pcVar5 + uVar10;
    if (pDVar6 != (Data *)0x0) goto LAB_0011d34a;
LAB_0011d351:
    QString::reallocData(a,(this->readBuffer).d.size,KeepSize);
    pDVar6 = (this->readBuffer).d.d;
    pcVar5 = (this->readBuffer).d.ptr;
    pcVar8 = pcVar5 + uVar10;
    if (pDVar6 != (Data *)0x0) goto LAB_0011d382;
LAB_0011d389:
    QString::reallocData(a,(this->readBuffer).d.size,KeepSize);
    pcVar5 = (this->readBuffer).d.ptr;
  }
  else {
    pcVar5 = (this->readBuffer).d.ptr;
    pcVar9 = pcVar5 + uVar10;
LAB_0011d34a:
    if (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)
    goto LAB_0011d351;
    pcVar8 = pcVar5 + uVar10;
LAB_0011d382:
    if (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)
    goto LAB_0011d389;
  }
  local_4058 = &(this->readBuffer).d.ptr;
  alloc_00 = (this->readBuffer).d.size;
  pcVar1 = pcVar5 + alloc_00;
  pcVar2 = pcVar8;
  if (pcVar8 < pcVar1) {
    do {
      pcVar8 = pcVar2 + 1;
      if (*pcVar2 == L'\r') break;
      uVar10 = uVar10 + 1;
      pcVar9 = pcVar9 + 1;
      pcVar2 = pcVar8;
    } while (pcVar9 != pcVar1);
  }
  if (pcVar8 < pcVar1) {
    lVar7 = this->readBufferOffset;
    do {
      if (*pcVar8 == L'\r') {
        if ((long)uVar10 < lVar7) {
          lVar7 = lVar7 + -1;
          this->readBufferOffset = lVar7;
        }
      }
      else {
        *pcVar9 = *pcVar8;
        pcVar9 = pcVar9 + 1;
      }
      pcVar8 = pcVar8 + 1;
      uVar10 = uVar10 + 1;
    } while (pcVar8 < pcVar1);
  }
  pDVar6 = (a->d).d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,alloc_00,KeepSize);
    pcVar5 = *local_4058;
  }
  QString::resize(a,(long)pcVar9 - (long)pcVar5 >> 1);
LAB_0011d445:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return 0 < sVar4;
}

Assistant:

bool QTextStreamPrivate::fillReadBuffer(qint64 maxBytes)
{
    // no buffer next to the QString itself; this function should only
    // be called internally, for devices.
    Q_ASSERT(!string);
    Q_ASSERT(device);

    // handle text translation and bypass the Text flag in the device.
    bool textModeEnabled = device->isTextModeEnabled();
    if (textModeEnabled)
        device->setTextModeEnabled(false);

    // read raw data into a temporary buffer
    char buf[QTEXTSTREAM_BUFFERSIZE];
    qint64 bytesRead = 0;
#if defined(Q_OS_WIN)
    // On Windows, there is no non-blocking stdin - so we fall back to reading
    // lines instead. If there is no QOBJECT, we read lines for all sequential
    // devices; otherwise, we read lines only for stdin.
    QFile *file = 0;
    Q_UNUSED(file);
    if (device->isSequential()
#if !defined(QT_NO_QOBJECT)
        && (file = qobject_cast<QFile *>(device)) && file->handle() == 0
#endif
        ) {
        if (maxBytes != -1)
            bytesRead = device->readLine(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->readLine(buf, sizeof(buf));
    } else
#endif
    {
        if (maxBytes != -1)
            bytesRead = device->read(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->read(buf, sizeof(buf));
    }

    // reset the Text flag.
    if (textModeEnabled)
        device->setTextModeEnabled(true);

    if (bytesRead <= 0)
        return false;

#ifndef QT_BOOTSTRAPPED
    if (autoDetectUnicode) {
        autoDetectUnicode = false;

        auto e = QStringConverter::encodingForData(QByteArrayView(buf, bytesRead));
        // QStringConverter::Locale implies unknown, so keep the current encoding
        if (e) {
            encoding = *e;
            toUtf16 = QStringDecoder(encoding);
            fromUtf16 = QStringEncoder(encoding);
        }
    }
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), using %s encoding", QStringConverter::nameForEncoding(encoding));
#endif
#endif

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), device->read(\"%s\", %d) == %d",
           QtDebugUtils::toPrintable(buf, bytesRead, 32).constData(),
           int(sizeof(buf)), int(bytesRead));
#endif

    qsizetype oldReadBufferSize = readBuffer.size();
    readBuffer += toUtf16(QByteArrayView(buf, bytesRead));

    // remove all '\r\n' in the string.
    if (readBuffer.size() > oldReadBufferSize && textModeEnabled) {
        QChar CR = u'\r';
        QChar *writePtr = readBuffer.data() + oldReadBufferSize;
        QChar *readPtr = readBuffer.data() + oldReadBufferSize;
        QChar *endPtr = readBuffer.data() + readBuffer.size();

        qsizetype n = oldReadBufferSize;
        if (readPtr < endPtr) {
            // Cut-off to avoid unnecessary self-copying.
            while (*readPtr++ != CR) {
                ++n;
                if (++writePtr == endPtr)
                    break;
            }
        }
        while (readPtr < endPtr) {
            QChar ch = *readPtr++;
            if (ch != CR) {
                *writePtr++ = ch;
            } else {
                if (n < readBufferOffset)
                    --readBufferOffset;
                --bytesRead;
            }
            ++n;
        }
        readBuffer.resize(writePtr - readBuffer.data());
    }

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer() read %d bytes from device. readBuffer = [%s]",
           int(bytesRead),
           QtDebugUtils::toPrintable(readBuffer.toLatin1(), readBuffer.size(),
                                     readBuffer.size()).constData());
#endif
    return true;
}